

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::create_expansion<false>
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,Siblings *siblings,
          Dictionary_it *s_h,Dictionary_it *next,Filtration_value *fil,int k,
          vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
          *added_simplices)

{
  long lVar1;
  bool bVar2;
  reference ppVar3;
  Siblings *siblings_00;
  reference ppVar4;
  long *in_FS_OFFSET;
  Simplex_handle root_sh;
  iterator it;
  __node_base local_58;
  Dictionary_const_it local_50;
  Dictionary_const_it local_48;
  Dictionary_const_it local_40;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_38;
  
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
  ::operator*(s_h);
  find_vertex((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)&root_sh,
              (Vertex_handle)this);
  if ((char)in_FS_OFFSET[-1] == '\0') {
    in_FS_OFFSET[-2] = 0;
    in_FS_OFFSET[-4] = 0;
    in_FS_OFFSET[-3] = 0;
    __cxa_thread_atexit(std::
                        vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                        ::~vector,*in_FS_OFFSET + -0x20,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  local_38.m_iit.members_.nodeptr_ = root_sh.m_iit.members_.nodeptr_;
  bVar2 = has_children<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                    (this,&local_38);
  if (bVar2) {
    lVar1 = *in_FS_OFFSET;
    local_50.m_iit.members_.nodeptr_ =
         (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )(next->m_iit).members_.nodeptr_;
    local_58._M_nxt =
         (_Hash_node_base *)
         ((long)&(siblings->members_).
                 super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                 .
                 super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                 .m_icont.
                 super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
         + 8);
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator*(&root_sh);
    local_40.m_iit.members_.nodeptr_ =
         *(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
           *)((long)&(((ppVar3->second).children_)->members_).
                     super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                     .
                     super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                     .m_icont.
                     super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                     .
                     super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
             + 0x10);
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator*(&root_sh);
    local_48.m_iit.members_.nodeptr_ =
         (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )((long)&(((ppVar3->second).children_)->members_).
                   super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                   .
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8);
    intersection<false>((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                         *)(lVar1 + -0x20),&local_50,(Dictionary_const_it *)&local_58,&local_40,
                        &local_48,fil);
    if (in_FS_OFFSET[-3] == in_FS_OFFSET[-4]) {
      ppVar4 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator*(s_h);
      (ppVar4->second).children_ = siblings;
      if (in_FS_OFFSET[-3] != in_FS_OFFSET[-4]) {
        in_FS_OFFSET[-3] = in_FS_OFFSET[-4];
      }
    }
    else {
      siblings_00 = (Siblings *)operator_new(0x30);
      ppVar4 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator*(s_h);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>
      ::
      Simplex_tree_siblings<std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>>>>
                ((Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>
                  *)siblings_00,siblings,ppVar4->first,
                 (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                  *)(lVar1 + -0x20));
      it.m_iit.members_.nodeptr_ =
           *(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
             *)((long)&(siblings_00->members_).
                       super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                       .
                       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                       .m_icont.
                       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               + 0x10);
      while (it.m_iit.members_.nodeptr_ !=
             (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
              )((long)&(siblings_00->members_).
                       super_tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
                       .
                       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                       .m_icont.
                       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_*,_std::less<int>,_boost::container::dtl::select1st<const_int>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               + 8U)) {
        boost::container::dtl::
        iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
        ::operator++(&it);
      }
      if (in_FS_OFFSET[-3] != in_FS_OFFSET[-4]) {
        in_FS_OFFSET[-3] = in_FS_OFFSET[-4];
      }
      ppVar4 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator*(s_h);
      (ppVar4->second).children_ = siblings_00;
      siblings_expansion(this,siblings_00,k + -1);
    }
  }
  return;
}

Assistant:

void create_expansion(Siblings * siblings,
                        Dictionary_it& s_h,
                        Dictionary_it& next,
                        const Filtration_value& fil,
                        int k,
                        std::vector<Simplex_handle>* added_simplices = nullptr)
  {
    Simplex_handle root_sh = find_vertex(s_h->first);
    thread_local std::vector<std::pair<Vertex_handle, Node> > inter;

    if (!has_children(root_sh)) return;

    intersection<force_filtration_value>(
          inter,  // output intersection
          next,   // begin
          siblings->members().end(),  // end
          root_sh->second.children()->members().begin(),
          root_sh->second.children()->members().end(),
          fil);
    if (inter.size() != 0) {
      Siblings * new_sib = new Siblings(siblings,   // oncles
                                        s_h->first, // parent
                                        inter);     // boost::container::ordered_unique_range_t
      for (auto it = new_sib->members().begin(); it != new_sib->members().end(); ++it) {
        update_simplex_tree_after_node_insertion(it);
        if constexpr (force_filtration_value){
          //the way create_expansion is used, added_simplices != nullptr when force_filtration_value == true
          added_simplices->push_back(it);
        }
      }
      inter.clear();
      s_h->second.assign_children(new_sib);
      if constexpr (force_filtration_value){
        siblings_expansion(new_sib, fil, k - 1, *added_simplices);
      } else {
        siblings_expansion(new_sib, k - 1);
      }
    } else {
      // ensure the children property
      s_h->second.assign_children(siblings);
      inter.clear();
    }
  }